

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int btreeBeginTrans(Btree *p,int wrflag,int *pSchemaVersion)

{
  int *piVar1;
  ushort uVar2;
  undefined2 uVar3;
  uint uVar4;
  u32 uVar5;
  Pgno PVar6;
  BtShared *pBt_00;
  Pager *pPager;
  Wal *pWVar7;
  MemPage *pMVar8;
  sqlite3 *psVar9;
  _func_int_void_ptr_int *p_Var10;
  uint uVar11;
  char cVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  BtLock *pBVar19;
  uint uVar20;
  u16 uVar21;
  Btree *pBVar22;
  u8 *puVar23;
  BtShared *pBt;
  uint uVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  MemPage *pPage1;
  int local_4c;
  uint *local_48;
  u32 *local_40;
  MemPage *local_38;
  
  pBt_00 = p->pBt;
  pPager = pBt_00->pPager;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  uVar14 = 0;
  if ((p->inTrans == '\x02') || (uVar14 = 0, wrflag == 0 && p->inTrans == '\x01'))
  goto LAB_0013bc3e;
  if (((p->db->flags & 0x2000000) != 0) && (pPager->readOnly == '\0')) {
    *(byte *)&pBt_00->btsFlags = (byte)pBt_00->btsFlags & 0xfe;
  }
  if ((wrflag != 0) && (uVar14 = 8, (pBt_00->btsFlags & 1) != 0)) goto LAB_0013bc3e;
  cVar12 = (char)pBt_00->btsFlags;
  if (wrflag == 0) {
    if (-1 < cVar12) goto LAB_0013b513;
LAB_0013b536:
    pBVar22 = pBt_00->pWriter;
LAB_0013b53e:
    bVar25 = pBVar22->db == (sqlite3 *)0x0;
  }
  else {
    if ((cVar12 < '\0') || (pBt_00->inTransaction == '\x02')) goto LAB_0013b536;
LAB_0013b513:
    bVar25 = true;
    if (1 < wrflag) {
      for (pBVar19 = pBt_00->pLock; pBVar19 != (BtLock *)0x0; pBVar19 = pBVar19->pNext) {
        pBVar22 = pBVar19->pBtree;
        if (pBVar22 != p) goto LAB_0013b53e;
      }
    }
  }
  uVar14 = 0x106;
  if ((bVar25) &&
     (local_48 = (uint *)pSchemaVersion, uVar14 = querySharedCacheTableLock(p,1,'\x01'),
     pSchemaVersion = (int *)local_48, uVar14 == 0)) {
    uVar2 = pBt_00->btsFlags;
    pBt_00->btsFlags = uVar2 & 0xffef;
    if (pBt_00->nPage == 0) {
      pBt_00->btsFlags = uVar2 | 0x10;
    }
    local_40 = &pBt_00->pageSize;
    uVar14 = 0;
    do {
      if (pBt_00->pPage1 == (MemPage *)0x0) {
        do {
          uVar16 = sqlite3PagerSharedLock(pBt_00->pPager);
          if ((uVar16 == 0) &&
             (uVar16 = btreeGetPage(pBt_00,1,&local_38,0), pMVar8 = local_38, uVar16 == 0)) {
            puVar23 = local_38->aData;
            uVar16 = *(uint *)(puVar23 + 0x1c);
            uVar24 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                     uVar16 << 0x18;
            uVar4 = pBt_00->pPager->dbSize;
            if ((uVar24 == 0) || (*(int *)(puVar23 + 0x18) != *(int *)(puVar23 + 0x5c))) {
              uVar24 = uVar4;
            }
            uVar15 = 0;
            if (((pBt_00->db->flags & 0x2000000) == 0) && (uVar24 != 0)) {
              auVar26[0] = -(*puVar23 == 'S');
              auVar26[1] = -(puVar23[1] == 'Q');
              auVar26[2] = -(puVar23[2] == 'L');
              auVar26[3] = -(puVar23[3] == 'i');
              auVar26[4] = -(puVar23[4] == 't');
              auVar26[5] = -(puVar23[5] == 'e');
              auVar26[6] = -(puVar23[6] == ' ');
              auVar26[7] = -(puVar23[7] == 'f');
              auVar26[8] = -(puVar23[8] == 'o');
              auVar26[9] = -(puVar23[9] == 'r');
              auVar26[10] = -(puVar23[10] == 'm');
              auVar26[0xb] = -(puVar23[0xb] == 'a');
              auVar26[0xc] = -(puVar23[0xc] == 't');
              auVar26[0xd] = -(puVar23[0xd] == ' ');
              auVar26[0xe] = -(puVar23[0xe] == '3');
              auVar26[0xf] = -(puVar23[0xf] == '\0');
              iVar17 = 2;
              uVar16 = 0x1a;
              if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar26[0xf] >> 7) << 0xf) == 0xffff) {
                if (2 < puVar23[0x12]) {
                  *(byte *)&pBt_00->btsFlags = (byte)pBt_00->btsFlags | 1;
                }
                if (puVar23[0x13] < 3) {
                  uVar16 = 0x1a;
                  if ((puVar23[0x13] == 2) && ((pBt_00->btsFlags & 0x20) == 0)) {
                    local_4c = 0;
                    uVar16 = sqlite3PagerOpenWal(pBt_00->pPager,&local_4c);
                    uVar14 = 0;
                    if (uVar16 == 0) {
                      if (local_4c == 0) {
                        releasePageOne(pMVar8);
                        bVar25 = false;
                        iVar17 = 1;
                        uVar16 = 0;
                      }
                      else {
                        uVar16 = 0x1a;
                        iVar17 = 0;
                        bVar25 = true;
                      }
                    }
                    else {
                      iVar17 = 2;
                      bVar25 = false;
                    }
                    if (!bVar25) goto LAB_0013b63c;
                  }
                  iVar17 = 2;
                  uVar14 = 0;
                  if (puVar23[0x17] == ' ' && *(short *)(puVar23 + 0x15) == 0x2040) {
                    uVar11 = (uint)puVar23[0x10] * 0x100;
                    uVar15 = (uint)puVar23[0x11] * 0x10000;
                    if ((0xffff00ff < (uVar15 + uVar11) - 0x10001) &&
                       (uVar20 = uVar15 | uVar11, uVar14 = 0, ((uVar11 + uVar15) - 1 & uVar20) == 0)
                       ) {
                      bVar13 = puVar23[0x14];
                      uVar14 = uVar20 - bVar13;
                      if (uVar20 == *local_40) {
                        uVar15 = uVar24;
                        if ((uVar4 < uVar24) &&
                           (uVar15 = uVar4, (pBt_00->db->flags & 0x10000001) != 1)) {
                          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11cac,
                                      "0f80b798b3f4b81a7bb4233c58294edd0f1156f36b6ecf5ab8e83631d468778c"
                                     );
                          uVar16 = 0xb;
                        }
                        else {
                          uVar24 = uVar15;
                          if (0x1df < uVar14) {
                            *(byte *)&pBt_00->btsFlags = (byte)pBt_00->btsFlags | 2;
                            pBt_00->pageSize = uVar20;
                            pBt_00->usableSize = uVar14;
                            uVar14 = *(uint *)(puVar23 + 0x34);
                            pBt_00->autoVacuum =
                                 ((uVar14 >> 0x18 != 0 || (uVar14 & 0xff0000) != 0) ||
                                 (uVar14 & 0xff00) != 0) || (uVar14 & 0xff) != 0;
                            uVar14 = *(uint *)(puVar23 + 0x40);
                            pBt_00->incrVacuum =
                                 ((uVar14 >> 0x18 != 0 || (uVar14 & 0xff0000) != 0) ||
                                 (uVar14 & 0xff00) != 0) || (uVar14 & 0xff) != 0;
                            iVar17 = 0;
                            uVar14 = 0;
                            goto LAB_0013b63c;
                          }
                        }
                        uVar14 = 0;
                        iVar17 = 2;
                      }
                      else {
                        releasePageOne(pMVar8);
                        pBt_00->usableSize = uVar14;
                        pBt_00->pageSize = uVar20;
                        *(byte *)&pBt_00->btsFlags = (byte)pBt_00->btsFlags | 2;
                        if (pBt_00->pTmpSpace != (u8 *)0x0) {
                          puVar23 = pBt_00->pTmpSpace + -4;
                          pBt_00->pTmpSpace = puVar23;
                          pcache1Free(puVar23);
                          pBt_00->pTmpSpace = (u8 *)0x0;
                        }
                        uVar14 = sqlite3PagerSetPagesize(pBt_00->pPager,local_40,(uint)bVar13);
                        iVar17 = 1;
                        uVar16 = uVar14;
                      }
                    }
                  }
                }
              }
LAB_0013b63c:
              if (iVar17 == 2) {
                releasePageOne(pMVar8);
                pBt_00->pPage1 = (MemPage *)0x0;
              }
              else {
                uVar16 = uVar14;
                uVar15 = uVar24;
                if (iVar17 == 0) goto LAB_0013b650;
              }
            }
            else {
LAB_0013b650:
              uVar5 = pBt_00->usableSize;
              uVar14 = (uVar5 * 0x40 - 0x300) / 0xff - 0x17;
              pBt_00->maxLocal = (u16)uVar14;
              uVar21 = (short)((uVar5 * 0x20 - 0x180) / 0xff) - 0x17;
              pBt_00->minLocal = uVar21;
              pBt_00->maxLeaf = (short)uVar5 - 0x23;
              pBt_00->minLeaf = uVar21;
              if ((uVar14 & 0xffff) < 0x80) {
                pBt_00->max1bytePayload = (u8)uVar14;
              }
              else {
                pBt_00->max1bytePayload = '\x7f';
              }
              pBt_00->pPage1 = pMVar8;
              pBt_00->nPage = uVar15;
              uVar16 = 0;
            }
          }
          uVar14 = uVar16;
          if (uVar14 != 0) goto LAB_0013b92f;
        } while (pBt_00->pPage1 == (MemPage *)0x0);
        uVar14 = 0;
      }
LAB_0013b92f:
      if (((wrflag != 0) && (uVar14 == 0)) && (uVar14 = 8, (pBt_00->btsFlags & 1) == 0)) {
        uVar14 = pPager->errCode;
        if (uVar14 == 0) {
          pPager->subjInMemory = p->db->temp_store == '\x02';
          uVar14 = 0;
          if (pPager->eState == '\x01') {
            if (pPager->pWal == (Wal *)0x0) {
              uVar14 = pagerLockDb(pPager,2);
              if (uVar14 == 0 && 1 < wrflag) {
                do {
                  uVar14 = pagerLockDb(pPager,4);
                  if (uVar14 != 5) break;
                  iVar17 = (*pPager->xBusyHandler)(pPager->pBusyHandlerArg);
                } while (iVar17 != 0);
              }
            }
            else {
              if ((pPager->exclusiveMode != '\0') && (pPager->pWal->exclusiveMode == '\0')) {
                uVar14 = pagerLockDb(pPager,4);
                if (uVar14 != 0) goto LAB_0013babf;
                pWVar7 = pPager->pWal;
                if (pWVar7->exclusiveMode == '\0') {
                  (*pWVar7->pDbFd->pMethods->xShmLock)(pWVar7->pDbFd,pWVar7->readLock + 3,1,5);
                }
                pWVar7->exclusiveMode = '\x01';
              }
              pWVar7 = pPager->pWal;
              uVar14 = 8;
              if (pWVar7->readOnly == '\0') {
                uVar14 = 0;
                if (pWVar7->exclusiveMode == '\0') {
                  uVar14 = (*pWVar7->pDbFd->pMethods->xShmLock)(pWVar7->pDbFd,0,1,10);
                }
                if (uVar14 == 0) {
                  pWVar7->writeLock = '\x01';
                  uVar14 = bcmp(&pWVar7->hdr,*pWVar7->apWiData,0x30);
                  if (uVar14 != 0) {
                    uVar14 = 0x205;
                    if (pWVar7->exclusiveMode == '\0') {
                      (*pWVar7->pDbFd->pMethods->xShmLock)(pWVar7->pDbFd,0,1,9);
                    }
                    pWVar7->writeLock = '\0';
                  }
                }
              }
            }
            if (uVar14 == 0) {
              pPager->eState = '\x02';
              PVar6 = pPager->dbSize;
              pPager->dbHintSize = PVar6;
              pPager->dbFileSize = PVar6;
              pPager->dbOrigSize = PVar6;
              pPager->journalOff = 0;
              uVar14 = 0;
            }
          }
        }
LAB_0013babf:
        if (uVar14 == 0x205) {
          uVar14 = (uint)(pBt_00->inTransaction != '\0') << 9 | 5;
        }
        else if (uVar14 == 0) {
          uVar14 = newDatabase(pBt_00);
        }
      }
      if (((uVar14 != 0) && (pBt_00->inTransaction == '\0')) &&
         (pMVar8 = pBt_00->pPage1, pMVar8 != (MemPage *)0x0)) {
        pBt_00->pPage1 = (MemPage *)0x0;
        releasePageOne(pMVar8);
      }
      if (((char)uVar14 != '\x05') || (pBt_00->inTransaction != '\0')) goto LAB_0013bbac;
      psVar9 = pBt_00->db;
      p_Var10 = (psVar9->busyHandler).xBusyHandler;
      if ((p_Var10 == (_func_int_void_ptr_int *)0x0) ||
         (iVar17 = (psVar9->busyHandler).nBusy, iVar17 < 0)) goto LAB_0013bbac;
      iVar17 = (*p_Var10)((psVar9->busyHandler).pBusyArg,iVar17);
      if (iVar17 == 0) {
        iVar18 = -1;
      }
      else {
        iVar18 = (psVar9->busyHandler).nBusy + 1;
      }
      (psVar9->busyHandler).nBusy = iVar18;
      if (iVar17 == 0) goto LAB_0013bbac;
    } while( true );
  }
LAB_0013bc3e:
  if (uVar14 == 0) {
    if ((uint *)pSchemaVersion != (uint *)0x0) {
      uVar14 = *(uint *)(pBt_00->pPage1->aData + 0x28);
      *pSchemaVersion =
           uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
    }
    uVar14 = 0;
    if (((wrflag != 0) && (iVar17 = p->db->nSavepoint, pPager->nSavepoint < iVar17)) &&
       (uVar14 = 0, pPager->useJournal != '\0')) {
      uVar14 = pagerOpenSavepoint(pPager,iVar17);
    }
  }
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  return uVar14;
LAB_0013bbac:
  pSchemaVersion = (int *)local_48;
  if (uVar14 == 0) {
    if ((p->inTrans == '\0') &&
       (pBt_00->nTransaction = pBt_00->nTransaction + 1, p->sharable != '\0')) {
      (p->lock).eLock = '\x01';
      (p->lock).pNext = pBt_00->pLock;
      pBt_00->pLock = &p->lock;
    }
    bVar13 = 2 - (wrflag == 0);
    p->inTrans = bVar13;
    if (pBt_00->inTransaction < bVar13) {
      pBt_00->inTransaction = bVar13;
    }
    uVar14 = 0;
    if (wrflag != 0) {
      pMVar8 = pBt_00->pPage1;
      pBt_00->pWriter = p;
      uVar3 = pBt_00->btsFlags;
      pBt_00->btsFlags = (ushort)(1 < wrflag) << 6 | uVar3 & 0xffbf;
      uVar16 = *(uint *)(pMVar8->aData + 0x1c);
      if ((pBt_00->nPage !=
           (uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18)) &&
         (uVar14 = sqlite3PagerWrite(pMVar8->pDbPage), pSchemaVersion = (int *)local_48, uVar14 == 0
         )) {
        uVar14 = pBt_00->nPage;
        *(uint *)(pMVar8->aData + 0x1c) =
             uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
        uVar14 = 0;
      }
    }
  }
  goto LAB_0013bc3e;
}

Assistant:

static SQLITE_NOINLINE int btreeBeginTrans(
  Btree *p,                 /* The btree in which to start the transaction */
  int wrflag,               /* True to start a write transaction */
  int *pSchemaVersion       /* Put schema version number here, if not NULL */
){
  BtShared *pBt = p->pBt;
  Pager *pPager = pBt->pPager;
  int rc = SQLITE_OK;

  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the btree is already in a write-transaction, or it
  ** is already in a read-transaction and a read-transaction
  ** is requested, this is a no-op.
  */
  if( p->inTrans==TRANS_WRITE || (p->inTrans==TRANS_READ && !wrflag) ){
    goto trans_begun;
  }
  assert( pBt->inTransaction==TRANS_WRITE || IfNotOmitAV(pBt->bDoTruncate)==0 );

  if( (p->db->flags & SQLITE_ResetDatabase)
   && sqlite3PagerIsreadonly(pPager)==0
  ){
    pBt->btsFlags &= ~BTS_READ_ONLY;
  }

  /* Write transactions are not possible on a read-only database */
  if( (pBt->btsFlags & BTS_READ_ONLY)!=0 && wrflag ){
    rc = SQLITE_READONLY;
    goto trans_begun;
  }

#ifndef SQLITE_OMIT_SHARED_CACHE
  {
    sqlite3 *pBlock = 0;
    /* If another database handle has already opened a write transaction
    ** on this shared-btree structure and a second write transaction is
    ** requested, return SQLITE_LOCKED.
    */
    if( (wrflag && pBt->inTransaction==TRANS_WRITE)
     || (pBt->btsFlags & BTS_PENDING)!=0
    ){
      pBlock = pBt->pWriter->db;
    }else if( wrflag>1 ){
      BtLock *pIter;
      for(pIter=pBt->pLock; pIter; pIter=pIter->pNext){
        if( pIter->pBtree!=p ){
          pBlock = pIter->pBtree->db;
          break;
        }
      }
    }
    if( pBlock ){
      sqlite3ConnectionBlocked(p->db, pBlock);
      rc = SQLITE_LOCKED_SHAREDCACHE;
      goto trans_begun;
    }
  }
#endif

  /* Any read-only or read-write transaction implies a read-lock on
  ** page 1. So if some other shared-cache client already has a write-lock
  ** on page 1, the transaction cannot be opened. */
  rc = querySharedCacheTableLock(p, SCHEMA_ROOT, READ_LOCK);
  if( SQLITE_OK!=rc ) goto trans_begun;

  pBt->btsFlags &= ~BTS_INITIALLY_EMPTY;
  if( pBt->nPage==0 ) pBt->btsFlags |= BTS_INITIALLY_EMPTY;
  do {
    sqlite3PagerWalDb(pPager, p->db);

#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
    /* If transitioning from no transaction directly to a write transaction,
    ** block for the WRITER lock first if possible. */
    if( pBt->pPage1==0 && wrflag ){
      assert( pBt->inTransaction==TRANS_NONE );
      rc = sqlite3PagerWalWriteLock(pPager, 1);
      if( rc!=SQLITE_BUSY && rc!=SQLITE_OK ) break;
    }
#endif

    /* Call lockBtree() until either pBt->pPage1 is populated or
    ** lockBtree() returns something other than SQLITE_OK. lockBtree()
    ** may return SQLITE_OK but leave pBt->pPage1 set to 0 if after
    ** reading page 1 it discovers that the page-size of the database
    ** file is not pBt->pageSize. In this case lockBtree() will update
    ** pBt->pageSize to the page-size of the file on disk.
    */
    while( pBt->pPage1==0 && SQLITE_OK==(rc = lockBtree(pBt)) );

    if( rc==SQLITE_OK && wrflag ){
      if( (pBt->btsFlags & BTS_READ_ONLY)!=0 ){
        rc = SQLITE_READONLY;
      }else{
        rc = sqlite3PagerBegin(pPager, wrflag>1, sqlite3TempInMemory(p->db));
        if( rc==SQLITE_OK ){
          rc = newDatabase(pBt);
        }else if( rc==SQLITE_BUSY_SNAPSHOT && pBt->inTransaction==TRANS_NONE ){
          /* if there was no transaction opened when this function was
          ** called and SQLITE_BUSY_SNAPSHOT is returned, change the error
          ** code to SQLITE_BUSY. */
          rc = SQLITE_BUSY;
        }
      }
    }

    if( rc!=SQLITE_OK ){
      (void)sqlite3PagerWalWriteLock(pPager, 0);
      unlockBtreeIfUnused(pBt);
    }
  }while( (rc&0xFF)==SQLITE_BUSY && pBt->inTransaction==TRANS_NONE &&
          btreeInvokeBusyHandler(pBt) );
  sqlite3PagerWalDb(pPager, 0);
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
  if( rc==SQLITE_BUSY_TIMEOUT ) rc = SQLITE_BUSY;
#endif

  if( rc==SQLITE_OK ){
    if( p->inTrans==TRANS_NONE ){
      pBt->nTransaction++;
#ifndef SQLITE_OMIT_SHARED_CACHE
      if( p->sharable ){
        assert( p->lock.pBtree==p && p->lock.iTable==1 );
        p->lock.eLock = READ_LOCK;
        p->lock.pNext = pBt->pLock;
        pBt->pLock = &p->lock;
      }
#endif
    }
    p->inTrans = (wrflag?TRANS_WRITE:TRANS_READ);
    if( p->inTrans>pBt->inTransaction ){
      pBt->inTransaction = p->inTrans;
    }
    if( wrflag ){
      MemPage *pPage1 = pBt->pPage1;
#ifndef SQLITE_OMIT_SHARED_CACHE
      assert( !pBt->pWriter );
      pBt->pWriter = p;
      pBt->btsFlags &= ~BTS_EXCLUSIVE;
      if( wrflag>1 ) pBt->btsFlags |= BTS_EXCLUSIVE;
#endif

      /* If the db-size header field is incorrect (as it may be if an old
      ** client has been writing the database file), update it now. Doing
      ** this sooner rather than later means the database size can safely
      ** re-read the database size from page 1 if a savepoint or transaction
      ** rollback occurs within the transaction.
      */
      if( pBt->nPage!=get4byte(&pPage1->aData[28]) ){
        rc = sqlite3PagerWrite(pPage1->pDbPage);
        if( rc==SQLITE_OK ){
          put4byte(&pPage1->aData[28], pBt->nPage);
        }
      }
    }
  }

trans_begun:
  if( rc==SQLITE_OK ){
    if( pSchemaVersion ){
      *pSchemaVersion = get4byte(&pBt->pPage1->aData[40]);
    }
    if( wrflag ){
      /* This call makes sure that the pager has the correct number of
      ** open savepoints. If the second parameter is greater than 0 and
      ** the sub-journal is not already open, then it will be opened here.
      */
      rc = sqlite3PagerOpenSavepoint(pPager, p->db->nSavepoint);
    }
  }

  btreeIntegrity(p);
  sqlite3BtreeLeave(p);
  return rc;
}